

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterBool::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterBool *this)

{
  TestResult *pTVar1;
  bool actual;
  int iVar2;
  Value *this_00;
  CharReader *pCVar3;
  allocator local_119;
  string errs;
  char doc [27];
  string local_d8;
  string local_b8;
  Value root;
  CharReaderBuilder b;
  Value local_40;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&root,nullValue);
  builtin_strncpy(doc + 0x10,"\ncomment*/",0xb);
  builtin_strncpy(doc," true /*trailing",0x10);
  Json::Value::Value(&local_40,true);
  this_00 = Json::Value::operator[](&b.settings_,"failIfExtra");
  Json::Value::operator=(this_00,&local_40);
  Json::Value::~Value(&local_40);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  iVar2 = (*pCVar3->_vptr_CharReader[2])(pCVar3,doc,doc + 0x1a,&root,&errs);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x81c,"ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_b8,"",&local_119);
  std::__cxx11::string::string((string *)&local_d8,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,&local_b8,&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x81d,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  actual = Json::Value::asBool(&root);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x81e,"true == root.asBool()");
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}